

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testDeserializeNewOrderSingle(int count)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  string string;
  Side side;
  HandlInst handlInst;
  TransactTime transactTime;
  Symbol symbol;
  ClOrdID clOrdID;
  NewOrderSingle message;
  OrdType ordType;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"ORDERID",(allocator<char> *)&handlInst);
  FIX::ClOrdID::ClOrdID(&clOrdID,(STRING *)&message);
  std::__cxx11::string::~string((string *)&message);
  message.super_Message.super_Message = (Message)0x31;
  FIX::HandlInst::HandlInst(&handlInst,(CHAR *)&message);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&message,"LNUX",(allocator<char> *)&side);
  FIX::Symbol::Symbol(&symbol,(STRING *)&message);
  std::__cxx11::string::~string((string *)&message);
  FIX::Side::Side(&side,"11FIX.4.2");
  FIX::TransactTime::now();
  FIX::OrdType::OrdType(&ordType,"1FIX.4.2");
  FIX42::NewOrderSingle::NewOrderSingle
            (&message,&clOrdID,&handlInst,&symbol,&side,&transactTime,&ordType);
  FIX::Message::toString_abi_cxx11_((int)&string,(int)&message,8);
  lVar1 = GetTickCount();
  if (count < 1) {
    count = 0;
  }
  while (bVar3 = count != 0, count = count + -1, bVar3) {
    FIX::Message::setString
              ((Message *)&message,&string,false,
               (DataDictionary *)
               s_dataDictionary._M_t.
               super___uniq_ptr_impl<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_FIX::DataDictionary_*,_std::default_delete<FIX::DataDictionary>_>
               .super__Head_base<0UL,_FIX::DataDictionary_*,_false>._M_head_impl);
  }
  lVar2 = GetTickCount();
  std::__cxx11::string::~string((string *)&string);
  FIX::Message::~Message((Message *)&message);
  FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
  FIX::FieldBase::~FieldBase((FieldBase *)&transactTime);
  FIX::FieldBase::~FieldBase((FieldBase *)&side);
  FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
  FIX::FieldBase::~FieldBase((FieldBase *)&handlInst);
  FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
  return lVar2 - lVar1;
}

Assistant:

long testDeserializeNewOrderSingle(int count) {
  FIX::ClOrdID clOrdID("ORDERID");
  FIX::HandlInst handlInst('1');
  FIX::Symbol symbol("LNUX");
  FIX::Side side(FIX::Side_BUY);
  FIX::TransactTime transactTime = FIX::TransactTime::now();
  FIX::OrdType ordType(FIX::OrdType_MARKET);
  FIX42::NewOrderSingle message(clOrdID, handlInst, symbol, side, transactTime, ordType);
  std::string string = message.toString();

  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    message.setString(string, DONT_VALIDATE, s_dataDictionary.get());
  }
  return GetTickCount() - start;
}